

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_wraith.cpp
# Opt level: O0

int AF_A_WraithFX3(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  int iVar1;
  bool bVar2;
  bool local_96;
  bool local_93;
  DVector3 local_90;
  FName local_74;
  double local_70;
  double zo;
  double yo;
  double xo;
  AActor *pAStack_50;
  int numdropped;
  AActor *mo;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  VMValue *pVStack_18;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pVStack_18 = param;
  param_local = (VMValue *)stack;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_wraith.cpp"
                  ,0x96,"int AF_A_WraithFX3(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar2) {
    stateowner = (AActor *)(param->field_0).field_1.a;
    local_93 = true;
    if (stateowner != (AActor *)0x0) {
      local_93 = DObject::IsKindOf((DObject *)stateowner,AActor::RegistrationInfo.MyClass);
    }
    if (local_93 == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_wraith.cpp"
                    ,0x96,"int AF_A_WraithFX3(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_18[(int)self].field_0.field_3.Type != 0xff)) {
      bVar2 = false;
      if ((pVStack_18[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar2 = true, pVStack_18[(int)self].field_0.field_1.atag != 1)) {
        bVar2 = pVStack_18[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar2) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_wraith.cpp"
                      ,0x96,"int AF_A_WraithFX3(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      stateinfo = (FStateParamInfo *)pVStack_18[(int)self].field_0.field_1.a;
      local_96 = true;
      if ((DObject *)stateinfo != (DObject *)0x0) {
        local_96 = DObject::IsKindOf((DObject *)stateinfo,AActor::RegistrationInfo.MyClass);
      }
      if (local_96 == false) {
        __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_wraith.cpp"
                      ,0x96,"int AF_A_WraithFX3(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
    else {
      stateinfo = (FStateParamInfo *)stateowner;
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_18[(int)self].field_0.field_3.Type != 0xff)) {
      bVar2 = false;
      if ((pVStack_18[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar2 = true, pVStack_18[(int)self].field_0.field_1.atag != 8)) {
        bVar2 = pVStack_18[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar2) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_wraith.cpp"
                      ,0x96,"int AF_A_WraithFX3(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      mo = (AActor *)pVStack_18[(int)self].field_0.field_1.a;
    }
    else {
      mo = (AActor *)0x0;
    }
    iVar1 = FRandom::operator()(&pr_wraithfx3);
    xo._4_4_ = iVar1 % 0xf;
    while (0 < xo._4_4_) {
      xo._4_4_ = xo._4_4_ + -1;
      iVar1 = FRandom::operator()(&pr_wraithfx3);
      yo = (double)(iVar1 + -0x80) / 32.0;
      iVar1 = FRandom::operator()(&pr_wraithfx3);
      zo = (double)(iVar1 + -0x80) / 32.0;
      iVar1 = FRandom::operator()(&pr_wraithfx3);
      local_70 = (double)iVar1 / 64.0;
      FName::FName(&local_74,"WraithFX3");
      AActor::Vec3Offset(&local_90,stateowner,yo,zo,local_70,false);
      pAStack_50 = Spawn(&local_74,&local_90,ALLOW_REPLACE);
      if (pAStack_50 != (AActor *)0x0) {
        pAStack_50->floorz = stateowner->floorz;
        pAStack_50->ceilingz = stateowner->ceilingz;
        TObjPtr<AActor>::operator=(&pAStack_50->target,stateowner);
      }
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_wraith.cpp"
                ,0x96,"int AF_A_WraithFX3(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_WraithFX3)
{
	PARAM_ACTION_PROLOGUE;

	AActor *mo;
	int numdropped = pr_wraithfx3() % 15;

	while (numdropped-- > 0)
	{
		double xo = (pr_wraithfx3() - 128) / 32.;
		double yo = (pr_wraithfx3() - 128) / 32.;
		double zo = pr_wraithfx3() / 64.;

		mo = Spawn("WraithFX3", self->Vec3Offset(xo, yo, zo), ALLOW_REPLACE);
		if (mo)
		{
			mo->floorz = self->floorz;
			mo->ceilingz = self->ceilingz;
			mo->target = self;
		}
	}
	return 0;
}